

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compute_distance_of_landscapes_on_grid.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  pointer pPVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  pointer pPVar8;
  long lVar9;
  size_type sVar10;
  long lVar11;
  char **__args;
  size_type sVar12;
  long lVar13;
  double dVar14;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  distance;
  vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
  landscaspes;
  ofstream out;
  allocator_type local_2a9;
  char **local_2a8;
  iterator iStack_2a0;
  char **local_298;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_288;
  double local_270;
  vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
  local_268;
  long local_248;
  value_type_conflict local_240;
  undefined1 local_238 [8];
  pointer pdStack_230;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_228;
  size_t sStack_210;
  size_t local_208;
  ios_base local_140 [272];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "This program computes distance of persistence landscapes on grid stored in files (the files needs to "
             ,0x65);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"be created beforehand).\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The first parameter of a program is an integer p. The program compute L^p distance of the two heat "
             ,99);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"maps. For L^infty distance choose p = -1. \n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The remaining parameters of this program are names of files with persistence landscapes on grid.\n"
             ,0x61);
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Wrong number of parameters, the program will now terminate \n"
               ,0x3c);
    iVar2 = 1;
  }
  else {
    iVar2 = atoi(argv[1]);
    if (iVar2 == -1) {
      local_270 = 1.79769313486232e+308;
    }
    else {
      local_270 = (double)iVar2;
    }
    local_2a8 = (char **)0x0;
    iStack_2a0._M_current = (char **)0x0;
    local_298 = (char **)0x0;
    __args = argv + 2;
    lVar6 = (ulong)(uint)argc - 2;
    do {
      if (iStack_2a0._M_current == local_298) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_2a8,iStack_2a0,__args);
      }
      else {
        *iStack_2a0._M_current = *__args;
        iStack_2a0._M_current = iStack_2a0._M_current + 1;
      }
      __args = __args + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    local_268.
    super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ::reserve(&local_268,(long)iStack_2a0._M_current - (long)local_2a8 >> 3);
    if (iStack_2a0._M_current == local_2a8) {
      sVar12 = 0;
    }
    else {
      sVar12 = 0;
      do {
        local_228.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        sStack_210 = 0;
        local_228.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_228.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_238 = (undefined1  [8])0x0;
        pdStack_230 = (pointer)0x0;
        local_208 = 0;
        Gudhi::Persistence_representations::Persistence_landscape_on_grid::load_landscape_from_file
                  ((Persistence_landscape_on_grid *)local_238,local_2a8[sVar12]);
        std::
        vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
        ::push_back(&local_268,(Persistence_landscape_on_grid *)local_238);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_228);
        sVar12 = sVar12 + 1;
      } while (sVar12 != (long)iStack_2a0._M_current - (long)local_2a8 >> 3);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_288,sVar12,(allocator_type *)local_238);
    if ((long)iStack_2a0._M_current - (long)local_2a8 != 0) {
      sVar12 = (long)iStack_2a0._M_current - (long)local_2a8 >> 3;
      lVar6 = 0;
      sVar10 = 0;
      do {
        local_240 = 0.0;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_238,sVar12,&local_240,&local_2a9
                  );
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&((local_288.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar6),
                   (vector<double,_std::allocator<double>_> *)local_238);
        if (local_238 != (undefined1  [8])0x0) {
          operator_delete((void *)local_238,
                          (long)local_228.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)local_238);
        }
        sVar10 = sVar10 + 1;
        sVar12 = (long)iStack_2a0._M_current - (long)local_2a8 >> 3;
        lVar6 = lVar6 + 0x18;
      } while (sVar10 != sVar12);
    }
    if (local_268.
        super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_268.
        super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar6 = 0;
      lVar9 = 0;
      lVar13 = 0;
      pPVar3 = local_268.
               super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pPVar8 = local_268.
               super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar5 = ((long)pPVar3 - (long)pPVar8 >> 3) * 0x6db6db6db6db6db7;
        lVar7 = lVar9;
        lVar11 = lVar13;
        local_248 = lVar6;
        if (lVar13 != lVar5) {
          do {
            dVar14 = Gudhi::Persistence_representations::compute_distance_of_landscapes_on_grid
                               (pPVar8 + lVar13,
                                (Persistence_landscape_on_grid *)((long)&pPVar8->grid_min + lVar7),
                                local_270);
            *(double *)
             (*(long *)((long)&((local_288.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar6) + lVar13 * 8) = dVar14;
            local_288.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar13].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar11] = dVar14;
            lVar11 = lVar11 + 1;
            lVar5 = ((long)local_268.
                           super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_268.
                           super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
            lVar7 = lVar7 + 0x38;
            lVar6 = lVar6 + 0x18;
            pPVar3 = local_268.
                     super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pPVar8 = local_268.
                     super__Vector_base<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          } while (lVar11 != lVar5);
        }
        lVar13 = lVar13 + 1;
        lVar9 = lVar9 + 0x38;
        lVar6 = local_248 + 0x18;
      } while (lVar13 != lVar5);
    }
    std::ofstream::ofstream(local_238);
    std::ofstream::open(local_238,0x1074a1);
    if (local_288.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_288.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar6 = 0;
      do {
        if (local_288.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_288.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar9 = 0;
          do {
            poVar4 = std::ostream::_M_insert<double>
                               (local_288.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            poVar4 = std::ostream::_M_insert<double>
                               (local_288.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            lVar9 = lVar9 + 1;
          } while (lVar9 != ((long)local_288.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_288.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555);
        }
        std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        cVar1 = (char)local_238;
        std::ios::widen(SUB81(*(pointer)((long)local_238 + -0x18),0) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        lVar6 = lVar6 + 1;
      } while (lVar6 != ((long)local_288.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_288.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
              );
    }
    std::ofstream::close();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Distance can be found in \'distance.g_land\' file\n",0x30);
    local_238 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_238 + (long)_VTT[-3]) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&pdStack_230);
    std::ios_base::~ios_base(local_140);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_288);
    std::
    vector<Gudhi::Persistence_representations::Persistence_landscape_on_grid,_std::allocator<Gudhi::Persistence_representations::Persistence_landscape_on_grid>_>
    ::~vector(&local_268);
    if (local_2a8 != (char **)0x0) {
      operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program computes distance of persistence landscapes on grid stored in files (the files needs to "
            << "be created beforehand).\n"
            << "The first parameter of a program is an integer p. The program compute L^p distance of the two heat "
            << "maps. For L^infty distance choose p = -1. \n"
            << "The remaining parameters of this program are names of files with persistence landscapes on grid.\n";

  if (argc < 3) {
    std::clog << "Wrong number of parameters, the program will now terminate \n";
    return 1;
  }

  int pp = atoi(argv[1]);
  double p = std::numeric_limits<double>::max();
  if (pp != -1) {
    p = pp;
  }

  std::vector<const char*> filenames;
  for (int i = 2; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }
  std::vector<Persistence_landscape_on_grid> landscaspes;
  landscaspes.reserve(filenames.size());
  for (size_t file_no = 0; file_no != filenames.size(); ++file_no) {
    Persistence_landscape_on_grid l;
    l.load_landscape_from_file(filenames[file_no]);
    landscaspes.push_back(l);
  }

  // and now we will compute the scalar product of landscapes.

  // first we prepare an array:
  std::vector<std::vector<double> > distance(filenames.size());
  for (size_t i = 0; i != filenames.size(); ++i) {
    std::vector<double> v(filenames.size(), 0);
    distance[i] = v;
  }

  // and now we can compute the scalar product:
  for (size_t i = 0; i != landscaspes.size(); ++i) {
    for (size_t j = i; j != landscaspes.size(); ++j) {
      distance[i][j] = distance[j][i] = compute_distance_of_landscapes_on_grid(landscaspes[i], landscaspes[j], p);
    }
  }

  // and now output the result to the screen and a file:
  std::ofstream out;
  out.open("distance.g_land");
  for (size_t i = 0; i != distance.size(); ++i) {
    for (size_t j = 0; j != distance.size(); ++j) {
      std::clog << distance[i][j] << " ";
      out << distance[i][j] << " ";
    }
    std::clog << std::endl;
    out << std::endl;
  }
  out.close();

  std::clog << "Distance can be found in 'distance.g_land' file\n";
  return 0;
}